

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderScalar(char *label,ImGuiDataType data_type,void *p_data,void *p_min,void *p_max,
                        char *format,ImGuiSliderFlags flags)

{
  float fVar1;
  ImDrawList *this;
  ImVec2 p_min_00;
  ImVec2 p_max_00;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id_00;
  ImU32 IVar4;
  int iVar5;
  ImGuiWindow *this_00;
  ImGuiDataTypeInfo *pIVar6;
  ImGuiCol idx;
  bool bVar7;
  float _x;
  ImGuiCol local_1c4;
  void *local_1c0;
  void *local_1b0;
  byte local_17b;
  bool local_17a;
  bool local_179;
  float local_16c;
  ImVec2 local_140;
  ImVec2 local_138;
  char *local_130;
  char *value_buf_end;
  char value_buf [64];
  undefined1 local_d8 [7];
  bool value_changed;
  ImRect grab_bb;
  ImU32 frame_col;
  bool is_clamp_input;
  bool clicked;
  bool focus_requested;
  bool temp_input_is_active;
  bool temp_input_allowed;
  bool hovered;
  ImVec2 local_a0;
  undefined1 local_98 [8];
  ImRect total_bb;
  ImVec2 local_80;
  undefined1 local_78 [8];
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *format_local;
  void *p_max_local;
  void *p_min_local;
  void *p_data_local;
  ImGuiDataType data_type_local;
  char *label_local;
  
  this_00 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((this_00->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this_00,label,(char *)0x0);
    _x = CalcItemWidth();
    frame_bb.Max = CalcTextSize(label,(char *)0x0,true,-1.0);
    fVar1 = (pIVar2->Style).FramePadding.y;
    ImVec2::ImVec2(&total_bb.Max,_x,fVar1 + fVar1 + frame_bb.Max.y);
    local_80 = operator+(&(this_00->DC).CursorPos,&total_bb.Max);
    ImRect::ImRect((ImRect *)local_78,&(this_00->DC).CursorPos,&local_80);
    if (frame_bb.Max.x <= 0.0) {
      local_16c = 0.0;
    }
    else {
      local_16c = (pIVar2->Style).ItemInnerSpacing.x + frame_bb.Max.x;
    }
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff58,local_16c,0.0);
    local_a0 = operator+(&frame_bb.Min,(ImVec2 *)&stack0xffffffffffffff58);
    ImRect::ImRect((ImRect *)local_98,(ImVec2 *)local_78,&local_a0);
    ItemSize((ImRect *)local_98,(pIVar2->Style).FramePadding.y);
    bVar3 = ItemAdd((ImRect *)local_98,id_00,(ImRect *)local_78);
    if (bVar3) {
      if (format == (char *)0x0) {
        pIVar6 = DataTypeGetInfo(data_type);
        window = (ImGuiWindow *)pIVar6->PrintFmt;
      }
      else {
        window = (ImGuiWindow *)format;
        if ((data_type == 4) && (iVar5 = strcmp(format,"%d"), iVar5 != 0)) {
          window = (ImGuiWindow *)PatchFormatStringFloatToInt(format);
        }
      }
      bVar3 = ItemHoverable((ImRect *)local_78,id_00);
      bVar7 = (flags & 0x80U) == 0;
      local_179 = false;
      if (bVar7) {
        local_179 = TempInputIsActive(id_00);
      }
      frame_col._1_1_ = local_179;
      if (local_179 == false) {
        local_17a = false;
        if (bVar7) {
          local_17a = FocusableItemRegister(this_00,id_00);
        }
        local_17b = 0;
        if (bVar3) {
          local_17b = (pIVar2->IO).MouseClicked[0];
        }
        if ((((local_17a != false) || ((local_17b & 1) != 0)) || (pIVar2->NavActivateId == id_00))
           || (pIVar2->NavInputId == id_00)) {
          SetActiveID(id_00,this_00);
          SetFocusID(id_00,this_00);
          FocusWindow(this_00);
          pIVar2->ActiveIdUsingNavDirMask = pIVar2->ActiveIdUsingNavDirMask | 3;
          if ((bVar7) &&
             (((local_17a != false || (((local_17b & 1) != 0 && (((pIVar2->IO).KeyCtrl & 1U) != 0)))
               ) || (pIVar2->NavInputId == id_00)))) {
            frame_col._1_1_ = true;
            FocusableItemUnregister(this_00);
          }
        }
      }
      if (frame_col._1_1_ == false) {
        if (pIVar2->ActiveId == id_00) {
          local_1c4 = 9;
        }
        else {
          local_1c4 = 7;
          if (pIVar2->HoveredId == id_00) {
            local_1c4 = 8;
          }
        }
        IVar4 = GetColorU32(local_1c4,1.0);
        RenderNavHighlight((ImRect *)local_78,id_00,1);
        p_min_00.y = (float)local_78._4_4_;
        p_min_00.x = (float)local_78._0_4_;
        p_max_00.y = frame_bb.Min.y;
        p_max_00.x = frame_bb.Min.x;
        RenderFrame(p_min_00,p_max_00,IVar4,true,(pIVar2->Style).FrameRounding);
        ImRect::ImRect((ImRect *)local_d8);
        label_local._7_1_ =
             SliderBehavior((ImRect *)local_78,id_00,data_type,p_data,p_min,p_max,(char *)window,
                            flags,(ImRect *)local_d8);
        if (label_local._7_1_) {
          MarkItemEdited(id_00);
        }
        if ((float)local_d8._0_4_ < grab_bb.Min.x) {
          this = this_00->DrawList;
          idx = 0x13;
          if (pIVar2->ActiveId == id_00) {
            idx = 0x14;
          }
          IVar4 = GetColorU32(idx,1.0);
          ImDrawList::AddRectFilled
                    (this,(ImVec2 *)local_d8,&grab_bb.Min,IVar4,(pIVar2->Style).GrabRounding,0xf);
        }
        iVar5 = DataTypeFormatString((char *)&value_buf_end,0x40,data_type,p_data,(char *)window);
        local_130 = value_buf + (long)iVar5 + -8;
        ImVec2::ImVec2(&local_138,0.5,0.5);
        RenderTextClipped((ImVec2 *)local_78,&frame_bb.Min,(char *)&value_buf_end,
                          value_buf + (long)iVar5 + -8,(ImVec2 *)0x0,&local_138,(ImRect *)0x0);
        if (0.0 < frame_bb.Max.x) {
          ImVec2::ImVec2(&local_140,frame_bb.Min.x + (pIVar2->Style).ItemInnerSpacing.x,
                         (float)local_78._4_4_ + (pIVar2->Style).FramePadding.y);
          RenderText(local_140,label,(char *)0x0,true);
        }
      }
      else {
        local_1c0 = p_max;
        local_1b0 = p_min;
        if ((flags & 0x10U) == 0) {
          local_1b0 = (void *)0x0;
          local_1c0 = (void *)0x0;
        }
        label_local._7_1_ =
             TempInputScalar((ImRect *)local_78,id_00,label,data_type,p_data,(char *)window,
                             local_1b0,local_1c0);
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::SliderScalar(const char* label, ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    // Tabbing or CTRL-clicking on Slider turns it into an input box
    const bool hovered = ItemHoverable(frame_bb, id);
    const bool temp_input_allowed = (flags & ImGuiSliderFlags_NoInput) == 0;
    bool temp_input_is_active = temp_input_allowed && TempInputIsActive(id);
    if (!temp_input_is_active)
    {
        const bool focus_requested = temp_input_allowed && FocusableItemRegister(window, id);
        const bool clicked = (hovered && g.IO.MouseClicked[0]);
        if (focus_requested || clicked || g.NavActivateId == id || g.NavInputId == id)
        {
            SetActiveID(id, window);
            SetFocusID(id, window);
            FocusWindow(window);
            g.ActiveIdUsingNavDirMask |= (1 << ImGuiDir_Left) | (1 << ImGuiDir_Right);
            if (temp_input_allowed && (focus_requested || (clicked && g.IO.KeyCtrl) || g.NavInputId == id))
            {
                temp_input_is_active = true;
                FocusableItemUnregister(window);
            }
        }
    }

    if (temp_input_is_active)
    {
        // Only clamp CTRL+Click input when ImGuiSliderFlags_AlwaysClamp is set
        const bool is_clamp_input = (flags & ImGuiSliderFlags_AlwaysClamp) != 0;
        return TempInputScalar(frame_bb, id, label, data_type, p_data, format, is_clamp_input ? p_min : NULL, is_clamp_input ? p_max : NULL);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, p_data, p_min, p_max, format, flags, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    if (grab_bb.Max.x > grab_bb.Min.x)
        window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.ItemFlags);
    return value_changed;
}